

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  wasm_valtype_t *r;
  wasm_functype_t *pwVar5;
  ulong local_c8;
  size_t i_1;
  wasm_frame_vec_t trace;
  wasm_frame_t *frame;
  wasm_name_t message;
  wasm_trap_t *trap;
  wasm_func_t *func;
  ulong uStack_80;
  int i;
  wasm_extern_vec_t exports;
  wasm_instance_t *instance;
  wasm_extern_t *imports [1];
  wasm_func_t *fail_func;
  wasm_functype_t *fail_type;
  wasm_module_t *module;
  wasm_byte_vec_t binary;
  size_t file_size;
  FILE *file;
  wasm_store_t *store;
  wasm_engine_t *engine;
  char **argv_local;
  int argc_local;
  
  printf("Initializing...\n");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  printf("Loading binary...\n");
  __stream = fopen("trap.wasm","r");
  if (__stream == (FILE *)0x0) {
    printf("> Error loading module!\n");
    argv_local._4_4_ = 1;
  }
  else {
    fseek(__stream,0,2);
    binary.data = (wasm_byte_t *)ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&module,binary.data);
    sVar3 = fread((void *)binary.size,(size_t)binary.data,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      printf("Compiling module...\n");
      lVar4 = wasm_module_new(uVar2,&module);
      if (lVar4 == 0) {
        printf("> Error compiling module!\n");
        argv_local._4_4_ = 1;
      }
      else {
        wasm_byte_vec_delete(&module);
        printf("Creating callback...\n");
        r = wasm_valtype_new_i32();
        pwVar5 = wasm_functype_new_0_1(r);
        imports[0] = (wasm_extern_t *)wasm_func_new_with_env(uVar2,pwVar5,fail_callback,uVar2,0);
        wasm_functype_delete(pwVar5);
        printf("Instantiating module...\n");
        instance = (wasm_instance_t *)wasm_func_as_extern(imports[0]);
        exports.data = (wasm_extern_t **)wasm_instance_new(uVar2,lVar4,&instance,0);
        if (exports.data == (wasm_extern_t **)0x0) {
          printf("> Error instantiating module!\n");
          argv_local._4_4_ = 1;
        }
        else {
          wasm_func_delete(imports[0]);
          printf("Extracting exports...\n");
          wasm_instance_exports(exports.data,&stack0xffffffffffffff80);
          if (uStack_80 < 2) {
            printf("> Error accessing exports!\n");
            argv_local._4_4_ = 1;
          }
          else {
            wasm_module_delete(lVar4);
            wasm_instance_delete(exports.data);
            for (func._4_4_ = 0; (int)func._4_4_ < 2; func._4_4_ = func._4_4_ + 1) {
              lVar4 = wasm_extern_as_func(*(undefined8 *)(exports.size + (long)(int)func._4_4_ * 8))
              ;
              if (lVar4 == 0) {
                printf("> Error accessing export!\n");
                return 1;
              }
              printf("Calling export %d...\n",(ulong)func._4_4_);
              message.data = (wasm_byte_t *)wasm_func_call(lVar4,0);
              if (message.data == (wasm_byte_t *)0x0) {
                printf("> Error calling function, expected trap!\n");
                return 1;
              }
              printf("Printing message...\n");
              wasm_trap_message(message.data,&frame);
              printf("> %s\n",message.size);
              printf("Printing origin...\n");
              trace.data = (wasm_frame_t **)wasm_trap_origin(message.data);
              if ((wasm_frame_t *)trace.data == (wasm_frame_t *)0x0) {
                printf("> Empty origin.\n");
              }
              else {
                print_frame((wasm_frame_t *)trace.data);
                wasm_frame_delete(trace.data);
              }
              printf("Printing trace...\n");
              wasm_trap_trace(message.data,&i_1);
              if (i_1 == 0) {
                printf("> Empty trace.\n");
              }
              else {
                for (local_c8 = 0; local_c8 < i_1; local_c8 = local_c8 + 1) {
                  print_frame(*(wasm_frame_t **)(trace.size + local_c8 * 8));
                }
              }
              wasm_frame_vec_delete(&i_1);
              wasm_trap_delete(message.data);
              wasm_byte_vec_delete(&frame);
            }
            wasm_extern_vec_delete(&stack0xffffffffffffff80);
            printf("Shutting down...\n");
            wasm_store_delete(uVar2);
            wasm_engine_delete(uVar1);
            printf("Done.\n");
            argv_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      printf("> Error loading module!\n");
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("trap.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  own wasm_functype_t* fail_type =
    wasm_functype_new_0_1(wasm_valtype_new_i32());
  own wasm_func_t* fail_func =
    wasm_func_new_with_env(store, fail_type, fail_callback, store, NULL);

  wasm_functype_delete(fail_type);

  // Instantiate.
  printf("Instantiating module...\n");
  const wasm_extern_t* imports[] = { wasm_func_as_extern(fail_func) };
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(fail_func);

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size < 2) {
    printf("> Error accessing exports!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  for (int i = 0; i < 2; ++i) {
    const wasm_func_t* func = wasm_extern_as_func(exports.data[i]);
    if (func == NULL) {
      printf("> Error accessing export!\n");
      return 1;
    }

    printf("Calling export %d...\n", i);
    own wasm_trap_t* trap = wasm_func_call(func, NULL, NULL);
    if (!trap) {
      printf("> Error calling function, expected trap!\n");
      return 1;
    }

    printf("Printing message...\n");
    own wasm_name_t message;
    wasm_trap_message(trap, &message);
    printf("> %s\n", message.data);

    printf("Printing origin...\n");
    own wasm_frame_t* frame = wasm_trap_origin(trap);
    if (frame) {
      print_frame(frame);
      wasm_frame_delete(frame);
    } else {
      printf("> Empty origin.\n");
    }

    printf("Printing trace...\n");
    own wasm_frame_vec_t trace;
    wasm_trap_trace(trap, &trace);
    if (trace.size > 0) {
      for (size_t i = 0; i < trace.size; ++i) {
        print_frame(trace.data[i]);
      }
    } else {
      printf("> Empty trace.\n");
    }

    wasm_frame_vec_delete(&trace);
    wasm_trap_delete(trap);
    wasm_name_delete(&message);
  }

  wasm_extern_vec_delete(&exports);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}